

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::js::api::json::ElementsAddPeginWitness::ConvertFromStruct
          (ElementsAddPeginWitness *this,ElementsAddPeginWitnessStruct *data)

{
  this->amount_ = data->amount;
  std::__cxx11::string::_M_assign((string *)&this->asset_);
  std::__cxx11::string::_M_assign((string *)&this->mainchain_genesis_block_hash_);
  std::__cxx11::string::_M_assign((string *)&this->claim_script_);
  std::__cxx11::string::_M_assign((string *)&this->mainchain_raw_transaction_);
  std::__cxx11::string::_M_assign((string *)&this->mainchain_txoutproof_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void ElementsAddPeginWitness::ConvertFromStruct(
    const ElementsAddPeginWitnessStruct& data) {
  amount_ = data.amount;
  asset_ = data.asset;
  mainchain_genesis_block_hash_ = data.mainchain_genesis_block_hash;
  claim_script_ = data.claim_script;
  mainchain_raw_transaction_ = data.mainchain_raw_transaction;
  mainchain_txoutproof_ = data.mainchain_txoutproof;
  ignore_items = data.ignore_items;
}